

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall player_t::player_t(player_t *this)

{
  player_t *this_local;
  
  this->mo = (APlayerPawn *)0x0;
  this->playerstate = '\0';
  userinfo_t::userinfo_t(&this->userinfo);
  this->cls = (PClassPlayerPawn *)0x0;
  this->DesiredFOV = 0.0;
  this->FOV = 0.0;
  this->viewz = 0.0;
  this->viewheight = 0.0;
  this->deltaviewheight = 0.0;
  this->bob = 0.0;
  TVector2<double>::TVector2(&this->Vel,0.0,0.0);
  this->centering = false;
  this->turnticks = '\0';
  this->attackdown = false;
  this->usedown = false;
  this->oldbuttons = 0;
  this->health = 0;
  this->inventorytics = 0;
  this->CurrentPlayerClass = '\0';
  this->fragcount = 0;
  this->lastkilltime = 0;
  this->multicount = '\0';
  this->spreecount = '\0';
  this->WeaponState = 0;
  this->ReadyWeapon = (AWeapon *)0x0;
  this->PendingWeapon = (AWeapon *)0x0;
  TObjPtr<DPSprite>::TObjPtr(&this->psprites,(DPSprite *)0x0);
  this->cheats = 0;
  this->timefreezer = 0;
  this->refire = 0;
  this->inconsistant = 0;
  this->killcount = 0;
  this->itemcount = 0;
  this->secretcount = 0;
  this->damagecount = 0;
  this->bonuscount = 0;
  this->hazardcount = 0;
  FName::FName(&this->hazardtype);
  this->poisoncount = 0;
  FName::FName(&this->poisontype);
  FName::FName(&this->poisonpaintype);
  TObjPtr<AActor>::TObjPtr(&this->poisoner,(AActor *)0x0);
  TObjPtr<AActor>::TObjPtr(&this->attacker,(AActor *)0x0);
  this->extralight = 0;
  this->morphTics = 0;
  this->MorphedPlayerClass = (PClassPlayerPawn *)0x0;
  this->MorphStyle = 0;
  this->MorphExitFlash = (PClassActor *)0x0;
  TObjPtr<AWeapon>::TObjPtr(&this->PremorphWeapon,(AWeapon *)0x0);
  this->chickenPeck = 0;
  this->jumpTics = 0;
  this->onground = false;
  this->respawn_time = 0;
  TObjPtr<AActor>::TObjPtr(&this->camera,(AActor *)0x0);
  this->air_finished = 0;
  FName::FName(&this->LastDamageType);
  TObjPtr<AActor>::TObjPtr(&this->MUSINFOactor,(AActor *)0x0);
  this->MUSINFOtics = -1;
  this->crouching = '\0';
  this->crouchdir = '\0';
  TObjPtr<DBot>::TObjPtr(&this->Bot,(DBot *)0x0);
  this->BlendR = 0.0;
  this->BlendG = 0.0;
  this->BlendB = 0.0;
  this->BlendA = 0.0;
  FString::FString(&this->LogText);
  TAngle<double>::TAngle(&this->MinPitch);
  TAngle<double>::TAngle(&this->MaxPitch);
  this->crouchfactor = 0.0;
  this->crouchoffset = 0.0;
  this->crouchviewdelta = 0.0;
  FWeaponSlots::FWeaponSlots(&this->weapons);
  TObjPtr<AActor>::TObjPtr(&this->ConversationNPC,(AActor *)0x0);
  TObjPtr<AActor>::TObjPtr(&this->ConversationPC,(AActor *)0x0);
  TAngle<double>::TAngle(&this->ConversationNPCAngle,0.0);
  this->ConversationFaceTalker = false;
  memset(&this->cmd,0,0x14);
  memset(this->frags,0,0x20);
  return;
}

Assistant:

player_t::player_t()
: mo(0),
  playerstate(0),
  cls(0),
  DesiredFOV(0),
  FOV(0),
  viewz(0),
  viewheight(0),
  deltaviewheight(0),
  bob(0),
  Vel(0, 0),
  centering(0),
  turnticks(0),
  attackdown(0),
  usedown(0),
  oldbuttons(0),
  health(0),
  inventorytics(0),
  CurrentPlayerClass(0),
  fragcount(0),
  lastkilltime(0),
  multicount(0),
  spreecount(0),
  WeaponState(0),
  ReadyWeapon(0),
  PendingWeapon(0),
  psprites(0),
  cheats(0),
  timefreezer(0),
  refire(0),
  inconsistant(0),
  killcount(0),
  itemcount(0),
  secretcount(0),
  damagecount(0),
  bonuscount(0),
  hazardcount(0),
  poisoncount(0),
  poisoner(0),
  attacker(0),
  extralight(0),
  morphTics(0),
  MorphedPlayerClass(0),
  MorphStyle(0),
  MorphExitFlash(0),
  PremorphWeapon(0),
  chickenPeck(0),
  jumpTics(0),
  onground(0),
  respawn_time(0),
  camera(0),
  air_finished(0),
  MUSINFOactor(0),
  MUSINFOtics(-1),
  crouching(0),
  crouchdir(0),
  Bot(0),
  BlendR(0),
  BlendG(0),
  BlendB(0),
  BlendA(0),
  LogText(),
  crouchfactor(0),
  crouchoffset(0),
  crouchviewdelta(0),
  ConversationNPC(0),
  ConversationPC(0),
  ConversationNPCAngle(0.),
  ConversationFaceTalker(0)
{
	memset (&cmd, 0, sizeof(cmd));
	memset (frags, 0, sizeof(frags));
}